

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PoolingLayerParams_ValidCompletePadding::Clear
          (PoolingLayerParams_ValidCompletePadding *this)

{
  uint32_t cached_has_bits;
  PoolingLayerParams_ValidCompletePadding *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::Clear(&this->paddingamounts_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void PoolingLayerParams_ValidCompletePadding::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.PoolingLayerParams.ValidCompletePadding)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  paddingamounts_.Clear();
  _internal_metadata_.Clear<std::string>();
}